

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O0

ssize_t __thiscall jessilib::config::write(config *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  undefined1 extraout_AL;
  undefined7 extraout_var;
  undefined1 local_20 [8];
  shared_lock<std::shared_mutex> guard;
  config *this_local;
  
  guard._8_8_ = this;
  std::shared_lock<std::shared_mutex>::shared_lock
            ((shared_lock<std::shared_mutex> *)local_20,&this->m_mutex);
  bVar1 = std::filesystem::__cxx11::path::empty(&this->m_filename);
  bVar1 = impl::_debug_assert_helper
                    (!bVar1,
                     "Failed assertion: \'!m_filename.empty()\' at /workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/common/config.cpp:94"
                    );
  if (bVar1) {
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      (&this->m_format);
    bVar1 = impl::_debug_assert_helper
                      (!bVar1,
                       "Failed assertion: \'!m_format.empty()\' at /workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/common/config.cpp:95"
                      );
    if (bVar1) {
      write_object(&this->m_data,&this->m_filename,&this->m_format,utf_8);
    }
  }
  std::shared_lock<std::shared_mutex>::~shared_lock((shared_lock<std::shared_mutex> *)local_20);
  return CONCAT71(extraout_var,extraout_AL);
}

Assistant:

void config::write() const {
	std::shared_lock<std::shared_mutex> guard{ m_mutex };

	if (jessilib_debug_assert(!m_filename.empty())
		&& jessilib_debug_assert(!m_format.empty())) {
		// Write data to disk
		write_object(m_data, m_filename, m_format);
	}
}